

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O2

void cf2_builder_cubeTo(CF2_OutlineCallbacks callbacks,CF2_CallbackParams params)

{
  PS_Builder *builder;
  int iVar1;
  
  builder = (PS_Builder *)callbacks[1].moveTo;
  if (builder->path_begun == '\0') {
    iVar1 = ps_builder_start_point(builder,(params->pt0).x,(params->pt0).y);
    if (iVar1 != 0) goto LAB_0014d41c;
  }
  iVar1 = ps_builder_check_points(builder,3);
  if (iVar1 == 0) {
    ps_builder_add_point(builder,(params->pt1).x,(params->pt1).y,'\0');
    ps_builder_add_point(builder,(params->pt2).x,(params->pt2).y,'\0');
    ps_builder_add_point(builder,(params->pt3).x,(params->pt3).y,'\x01');
    return;
  }
LAB_0014d41c:
  if (*callbacks->error == 0) {
    *callbacks->error = iVar1;
  }
  return;
}

Assistant:

static void
  cf2_builder_cubeTo( CF2_OutlineCallbacks      callbacks,
                      const CF2_CallbackParams  params )
  {
    FT_Error  error;

    /* downcast the object pointer */
    CF2_Outline  outline = (CF2_Outline)callbacks;
    PS_Builder*  builder;


    FT_ASSERT( outline && outline->decoder );
    FT_ASSERT( params->op == CF2_PathOpCubeTo );

    builder = &outline->decoder->builder;

    if ( !builder->path_begun )
    {
      /* record the move before the line; also check points and set */
      /* `path_begun'                                               */
      error = ps_builder_start_point( builder,
                                      params->pt0.x,
                                      params->pt0.y );
      if ( error )
      {
        if ( !*callbacks->error )
          *callbacks->error =  error;
        return;
      }
    }

    /* prepare room for 3 points: 2 off-curve, 1 on-curve */
    error = ps_builder_check_points( builder, 3 );
    if ( error )
    {
      if ( !*callbacks->error )
        *callbacks->error =  error;
      return;
    }

    ps_builder_add_point( builder,
                          params->pt1.x,
                          params->pt1.y, 0 );
    ps_builder_add_point( builder,
                          params->pt2.x,
                          params->pt2.y, 0 );
    ps_builder_add_point( builder,
                          params->pt3.x,
                          params->pt3.y, 1 );
  }